

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_binarymodelserialiser.cpp
# Opt level: O2

void __thiscall tst_BinaryModelSerialiser::basicSaveLoadStream(tst_BinaryModelSerialiser *this)

{
  QAbstractItemModel *a;
  QAbstractItemModel *b;
  undefined8 *puVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  BinaryModelSerialiser serialiser;
  QByteArray dataArray;
  QDataStream readStream;
  QDataStream writeStream;
  QModelIndex local_50;
  QModelIndex local_38;
  
  iVar4 = qMetaTypeId<QAbstractItemModel_const*>();
  puVar1 = (undefined8 *)QTest::qData("sourceModel",iVar4);
  a = (QAbstractItemModel *)*puVar1;
  iVar4 = qMetaTypeId<QAbstractItemModel*>();
  puVar1 = (undefined8 *)QTest::qData("destinationModel",iVar4);
  b = (QAbstractItemModel *)*puVar1;
  BinaryModelSerialiser::BinaryModelSerialiser(&serialiser,a,(QObject *)0x0);
  AbstractModelSerialiser::addRoleToSave((int)&serialiser);
  dataArray.d.d = (Data *)0x0;
  dataArray.d.ptr = (char *)0x0;
  dataArray.d.size = 0;
  QDataStream::QDataStream(&writeStream,&dataArray,2);
  bVar2 = (bool)BinaryModelSerialiser::saveModel((QDataStream *)&serialiser);
  cVar3 = QTest::qVerify(bVar2,"serialiser.saveModel(writeStream)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_BinaryModelSerialiser/tst_binarymodelserialiser.cpp"
                         ,0x2d);
  if (cVar3 != '\0') {
    QDataStream::QDataStream(&readStream,&dataArray);
    AbstractModelSerialiser::setModel((QAbstractItemModel *)&serialiser);
    bVar2 = (bool)BinaryModelSerialiser::loadModel((QDataStream *)&serialiser);
    cVar3 = QTest::qVerify(bVar2,"serialiser.loadModel(readStream)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_BinaryModelSerialiser/tst_binarymodelserialiser.cpp"
                           ,0x30);
    if (cVar3 != '\0') {
      local_38.r = -1;
      local_38.c = -1;
      local_38.i = 0;
      local_38.m = (QAbstractItemModel *)0x0;
      local_50.r = -1;
      local_50.c = -1;
      local_50.i = 0;
      local_50.m = (QAbstractItemModel *)0x0;
      tst_SerialiserCommon::checkModelEqual
                (&this->super_tst_SerialiserCommon,a,b,&local_38,&local_50,true);
      QObject::deleteLater();
    }
    QDataStream::~QDataStream(&readStream);
  }
  QDataStream::~QDataStream(&writeStream);
  QArrayDataPointer<char>::~QArrayDataPointer(&dataArray.d);
  BinaryModelSerialiser::~BinaryModelSerialiser(&serialiser);
  return;
}

Assistant:

void tst_BinaryModelSerialiser::basicSaveLoadStream()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    BinaryModelSerialiser serialiser(sourceModel, nullptr);
    serialiser.addRoleToSave(Qt::UserRole + 1);
    QByteArray dataArray;
    QDataStream writeStream(&dataArray, QIODevice::WriteOnly);
    QVERIFY(serialiser.saveModel(writeStream));
    QDataStream readStream(dataArray);
    serialiser.setModel(destinationModel);
    QVERIFY(serialiser.loadModel(readStream));
    checkModelEqual(sourceModel, destinationModel);
    destinationModel->deleteLater();
}